

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O0

FString __thiscall FString::operator+(FString *this,FString *tail)

{
  FString *in_RDX;
  FString *tail_local;
  FString *this_local;
  
  FString(this,tail,in_RDX);
  return (FString)(char *)this;
}

Assistant:

FString FString::operator + (const FString &tail) const
{
	return FString (*this, tail);
}